

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O0

String * sf::priv::KeyboardImpl::getDescription(Scancode code)

{
  int in_ESI;
  String *in_RDI;
  Uint32 unicode;
  KeySym keysym;
  bool checkInput;
  undefined8 in_stack_fffffffffffff9a8;
  String *in_stack_fffffffffffff9b0;
  locale *in_stack_fffffffffffff9e0;
  locale *plVar1;
  char *in_stack_fffffffffffff9e8;
  String *in_stack_fffffffffffff9f0;
  locale local_340 [8];
  locale local_338 [8];
  locale local_330 [8];
  locale local_328 [8];
  locale local_320 [8];
  locale local_318 [8];
  locale local_310 [8];
  locale local_308 [8];
  locale local_300 [8];
  locale local_2f8 [8];
  locale local_2f0 [8];
  locale local_2e8 [8];
  locale local_2e0 [8];
  locale local_2d8 [8];
  locale local_2d0 [8];
  locale local_2c8 [8];
  locale local_2c0 [8];
  locale local_2b8 [8];
  locale local_2b0 [8];
  locale local_2a8 [8];
  locale local_2a0 [8];
  locale local_298 [8];
  locale local_290 [8];
  locale local_288 [8];
  locale local_280 [8];
  locale local_278 [8];
  locale local_270 [8];
  locale local_268 [8];
  locale local_260 [8];
  locale local_258 [8];
  locale local_250 [8];
  locale local_248 [8];
  locale local_240 [8];
  locale local_238 [8];
  locale local_230 [8];
  locale local_228 [8];
  locale local_220 [8];
  locale local_218 [8];
  locale local_210 [8];
  locale local_208 [8];
  locale local_200 [8];
  locale local_1f8 [8];
  locale local_1f0 [8];
  locale local_1e8 [8];
  locale local_1e0 [8];
  locale local_1d8 [8];
  locale local_1d0 [8];
  locale local_1c8 [8];
  locale local_1c0 [8];
  locale local_1b8 [8];
  locale local_1b0 [8];
  locale local_1a8 [8];
  locale local_1a0 [8];
  locale local_198 [8];
  locale local_190 [8];
  locale local_188 [8];
  locale local_180 [8];
  locale local_178 [8];
  locale local_170 [8];
  locale local_168 [8];
  locale local_160 [8];
  locale local_158 [8];
  locale local_150 [8];
  locale local_148 [8];
  locale local_140 [8];
  locale local_138 [8];
  locale local_130 [8];
  locale local_128 [8];
  locale local_120 [8];
  locale local_118 [8];
  locale local_110 [8];
  locale local_108 [8];
  locale local_100 [8];
  locale local_f8 [8];
  locale local_f0 [8];
  locale local_e8 [8];
  locale local_e0 [8];
  locale local_d8 [8];
  locale local_d0 [8];
  locale local_c8 [8];
  locale local_c0 [8];
  locale local_b8 [8];
  locale local_b0 [8];
  locale local_a8 [8];
  locale local_a0 [8];
  locale local_98 [8];
  locale local_90 [8];
  locale local_88 [8];
  locale local_80 [8];
  locale local_78 [8];
  locale local_70 [8];
  locale local_68 [8];
  locale local_60 [8];
  locale local_58 [8];
  locale local_50 [8];
  locale local_48 [8];
  locale local_40 [24];
  locale local_28 [12];
  Uint32 local_1c;
  KeySym local_18;
  char local_d;
  int local_c;
  
  local_d = '\x01';
  if (((((in_ESI == 0x24) || (in_ESI == 0x25)) || (in_ESI == 0x26)) ||
      (((in_ESI == 0x27 || (in_ESI == 0x28)) ||
       ((in_ESI == 0x4e || ((in_ESI == 0x4f || (in_ESI == 0x53)))))))) ||
     ((in_ESI == 0x5b ||
      (((((in_ESI == 0x5c || (in_ESI == 0x5d)) || (in_ESI == 0x5e)) ||
        ((in_ESI == 0x5f || (in_ESI == 0x60)))) || (in_ESI == 0x61)))))) {
    local_d = '\0';
  }
  local_c = in_ESI;
  if (local_d != '\0') {
    local_18 = anon_unknown.dwarf_4227ad::scancodeToKeySym
                         ((Scancode)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
    local_1c = keysymToUnicode(local_18);
    if (local_1c != 0) {
      String::String(in_stack_fffffffffffff9b0,(Uint32)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      return in_RDI;
    }
    local_1c = 0;
  }
  switch(local_c) {
  case 0x24:
    std::locale::locale(local_28);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_28);
    break;
  case 0x25:
    std::locale::locale(local_40);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_40);
    break;
  case 0x26:
    std::locale::locale(local_48);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_48);
    break;
  case 0x27:
    std::locale::locale(local_50);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_50);
    break;
  case 0x28:
    std::locale::locale(local_58);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_58);
    break;
  default:
    std::locale::locale(local_340);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_340);
    break;
  case 0x34:
    std::locale::locale(local_60);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_60);
    break;
  case 0x35:
    std::locale::locale(local_68);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_68);
    break;
  case 0x36:
    std::locale::locale(local_70);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_70);
    break;
  case 0x37:
    std::locale::locale(local_78);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_78);
    break;
  case 0x38:
    std::locale::locale(local_80);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_80);
    break;
  case 0x39:
    std::locale::locale(local_88);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_88);
    break;
  case 0x3a:
    std::locale::locale(local_90);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_90);
    break;
  case 0x3b:
    std::locale::locale(local_98);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_98);
    break;
  case 0x3c:
    std::locale::locale(local_a0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_a0);
    break;
  case 0x3d:
    std::locale::locale(local_a8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_a8);
    break;
  case 0x3e:
    std::locale::locale(local_b0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_b0);
    break;
  case 0x3f:
    std::locale::locale(local_b8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_b8);
    break;
  case 0x40:
    std::locale::locale(local_c0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_c0);
    break;
  case 0x41:
    std::locale::locale(local_c8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_c8);
    break;
  case 0x42:
    std::locale::locale(local_d0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_d0);
    break;
  case 0x43:
    std::locale::locale(local_d8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_d8);
    break;
  case 0x44:
    std::locale::locale(local_e0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_e0);
    break;
  case 0x45:
    std::locale::locale(local_e8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_e8);
    break;
  case 0x46:
    std::locale::locale(local_f0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_f0);
    break;
  case 0x47:
    std::locale::locale(local_f8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_f8);
    break;
  case 0x48:
    std::locale::locale(local_100);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_100);
    break;
  case 0x49:
    std::locale::locale(local_108);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_108);
    break;
  case 0x4a:
    std::locale::locale(local_110);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_110);
    break;
  case 0x4b:
    std::locale::locale(local_118);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_118);
    break;
  case 0x4c:
    std::locale::locale(local_120);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_120);
    break;
  case 0x4d:
    std::locale::locale(local_128);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_128);
    break;
  case 0x4e:
    std::locale::locale(local_130);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_130);
    break;
  case 0x4f:
    std::locale::locale(local_138);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_138);
    break;
  case 0x50:
    std::locale::locale(local_140);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_140);
    break;
  case 0x51:
    std::locale::locale(local_148);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_148);
    break;
  case 0x52:
    std::locale::locale(local_150);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_150);
    break;
  case 0x53:
    std::locale::locale(local_158);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_158);
    break;
  case 0x54:
    std::locale::locale(local_160);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_160);
    break;
  case 0x55:
    std::locale::locale(local_168);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_168);
    break;
  case 0x56:
    std::locale::locale(local_178);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_178);
    break;
  case 0x57:
    std::locale::locale(local_170);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_170);
    break;
  case 0x58:
    std::locale::locale(local_180);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_180);
    break;
  case 0x59:
    std::locale::locale(local_188);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_188);
    break;
  case 0x5a:
    std::locale::locale(local_190);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_190);
    break;
  case 0x5b:
    std::locale::locale(local_198);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_198);
    break;
  case 0x5c:
    std::locale::locale(local_1a0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1a0);
    break;
  case 0x5d:
    std::locale::locale(local_1a8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1a8);
    break;
  case 0x5e:
    std::locale::locale(local_1b0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1b0);
    break;
  case 0x5f:
    std::locale::locale(local_1b8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1b8);
    break;
  case 0x60:
    std::locale::locale(local_1c0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1c0);
    break;
  case 0x61:
    std::locale::locale(local_1c8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1c8);
    break;
  case 0x62:
    std::locale::locale(local_1d8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1d8);
    break;
  case 99:
    std::locale::locale(local_1e0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1e0);
    break;
  case 100:
    std::locale::locale(local_1e8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1e8);
    break;
  case 0x65:
    std::locale::locale(local_1f0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1f0);
    break;
  case 0x66:
    std::locale::locale(local_1f8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1f8);
    break;
  case 0x67:
    std::locale::locale(local_200);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_200);
    break;
  case 0x68:
    std::locale::locale(local_208);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_208);
    break;
  case 0x69:
    std::locale::locale(local_210);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_210);
    break;
  case 0x6a:
    std::locale::locale(local_218);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_218);
    break;
  case 0x6b:
    std::locale::locale(local_1d0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_1d0);
    break;
  case 0x6d:
    std::locale::locale(local_220);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_220);
    break;
  case 0x6e:
    std::locale::locale(local_228);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_228);
    break;
  case 0x70:
    std::locale::locale(local_230);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_230);
    break;
  case 0x71:
    std::locale::locale(local_238);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_238);
    break;
  case 0x72:
    std::locale::locale(local_240);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_240);
    break;
  case 0x73:
    std::locale::locale(local_250);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_250);
    break;
  case 0x74:
    std::locale::locale(local_258);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_258);
    break;
  case 0x75:
    std::locale::locale(local_260);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_260);
    break;
  case 0x76:
    std::locale::locale(local_268);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_268);
    break;
  case 0x77:
    std::locale::locale(local_270);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_270);
    break;
  case 0x78:
    std::locale::locale(local_280);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_280);
    break;
  case 0x79:
    std::locale::locale(local_288);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_288);
    break;
  case 0x7a:
    std::locale::locale(local_290);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_290);
    break;
  case 0x7b:
    std::locale::locale(local_308);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_308);
    break;
  case 0x7c:
    std::locale::locale(local_318);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_318);
    break;
  case 0x7d:
    std::locale::locale(local_300);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_300);
    break;
  case 0x7e:
    std::locale::locale(local_310);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_310);
    break;
  case 0x7f:
    std::locale::locale(local_298);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_298);
    break;
  case 0x80:
    std::locale::locale(local_2a0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2a0);
    break;
  case 0x81:
    std::locale::locale(local_2a8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2a8);
    break;
  case 0x82:
    std::locale::locale(local_2b0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2b0);
    break;
  case 0x83:
    std::locale::locale(local_2b8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2b8);
    break;
  case 0x84:
    std::locale::locale(local_2c0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2c0);
    break;
  case 0x85:
    std::locale::locale(local_2c8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2c8);
    break;
  case 0x86:
    std::locale::locale(local_2d0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2d0);
    break;
  case 0x87:
    plVar1 = local_2f0;
    std::locale::locale(plVar1);
    String::String(in_stack_fffffffffffff9f0,(char *)plVar1,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2f0);
    break;
  case 0x88:
    plVar1 = local_2f8;
    std::locale::locale(plVar1);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,plVar1);
    std::locale::~locale(local_2f8);
    break;
  case 0x89:
    std::locale::locale(local_328);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_328);
    break;
  case 0x8a:
    std::locale::locale(local_248);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_248);
    break;
  case 0x8b:
    std::locale::locale(local_278);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_278);
    break;
  case 0x8c:
    plVar1 = local_2e8;
    std::locale::locale(plVar1);
    String::String((String *)plVar1,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2e8);
    break;
  case 0x8d:
    std::locale::locale(local_320);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_320);
    break;
  case 0x8e:
    std::locale::locale(local_2d8);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2d8);
    break;
  case 0x8f:
    std::locale::locale(local_2e0);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_2e0);
    break;
  case 0x90:
    std::locale::locale(local_330);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_330);
    break;
  case 0x91:
    std::locale::locale(local_338);
    String::String(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::locale::~locale(local_338);
  }
  return in_RDI;
}

Assistant:

String KeyboardImpl::getDescription(Keyboard::Scancode code)
{
    bool checkInput = true;

    // these scancodes actually correspond to keys with input
    // but we want to return their description, not their behaviour
    if (code == Keyboard::Scan::Enter          ||
        code == Keyboard::Scan::Escape         ||
        code == Keyboard::Scan::Backspace      ||
        code == Keyboard::Scan::Tab            ||
        code == Keyboard::Scan::Space          ||
        code == Keyboard::Scan::ScrollLock     ||
        code == Keyboard::Scan::Pause          ||
        code == Keyboard::Scan::Delete         ||
        code == Keyboard::Scan::NumpadDivide   ||
        code == Keyboard::Scan::NumpadMultiply ||
        code == Keyboard::Scan::NumpadMinus    ||
        code == Keyboard::Scan::NumpadPlus     ||
        code == Keyboard::Scan::NumpadEqual    ||
        code == Keyboard::Scan::NumpadEnter    ||
        code == Keyboard::Scan::NumpadDecimal)
    {
        checkInput = false;
    }

    if (checkInput)
    {
        KeySym keysym = scancodeToKeySym(code);
        Uint32 unicode = keysymToUnicode(keysym);

        if (unicode != 0)
            return String(unicode);
    }

    // Fallback to our best guess for the keys that are known to be independent of the layout.
    switch (code)
    {
        case Keyboard::Scan::Enter:              return "Enter";
        case Keyboard::Scan::Escape:             return "Escape";
        case Keyboard::Scan::Backspace:          return "Backspace";
        case Keyboard::Scan::Tab:                return "Tab";
        case Keyboard::Scan::Space:              return "Space";

        case Keyboard::Scan::F1:                 return "F1";
        case Keyboard::Scan::F2:                 return "F2";
        case Keyboard::Scan::F3:                 return "F3";
        case Keyboard::Scan::F4:                 return "F4";
        case Keyboard::Scan::F5:                 return "F5";
        case Keyboard::Scan::F6:                 return "F6";
        case Keyboard::Scan::F7:                 return "F7";
        case Keyboard::Scan::F8:                 return "F8";
        case Keyboard::Scan::F9:                 return "F9";
        case Keyboard::Scan::F10:                return "F10";
        case Keyboard::Scan::F11:                return "F11";
        case Keyboard::Scan::F12:                return "F12";
        case Keyboard::Scan::F13:                return "F13";
        case Keyboard::Scan::F14:                return "F14";
        case Keyboard::Scan::F15:                return "F15";
        case Keyboard::Scan::F16:                return "F16";
        case Keyboard::Scan::F17:                return "F17";
        case Keyboard::Scan::F18:                return "F18";
        case Keyboard::Scan::F19:                return "F19";
        case Keyboard::Scan::F20:                return "F20";
        case Keyboard::Scan::F21:                return "F21";
        case Keyboard::Scan::F22:                return "F22";
        case Keyboard::Scan::F23:                return "F23";
        case Keyboard::Scan::F24:                return "F24";

        case Keyboard::Scan::CapsLock:           return "Caps Lock";
        case Keyboard::Scan::PrintScreen:        return "Print Screen";
        case Keyboard::Scan::ScrollLock:         return "Scroll Lock";

        case Keyboard::Scan::Pause:              return "Pause";
        case Keyboard::Scan::Insert:             return "Insert";
        case Keyboard::Scan::Home:               return "Home";
        case Keyboard::Scan::PageUp:             return "Page Up";
        case Keyboard::Scan::Delete:             return "Delete";
        case Keyboard::Scan::End:                return "End";
        case Keyboard::Scan::PageDown:           return "Page Down";

        case Keyboard::Scan::Left:               return "Left Arrow";
        case Keyboard::Scan::Right:              return "Right Arrow";
        case Keyboard::Scan::Down:               return "Down Arrow";
        case Keyboard::Scan::Up:                 return "Up Arrow";

        case Keyboard::Scan::NumLock:            return "Num Lock";
        case Keyboard::Scan::NumpadDivide:       return "Divide (Numpad)";
        case Keyboard::Scan::NumpadMultiply:     return "Multiply (Numpad)";
        case Keyboard::Scan::NumpadMinus:        return "Minus (Numpad)";
        case Keyboard::Scan::NumpadPlus:         return "Plus (Numpad)";
        case Keyboard::Scan::NumpadEqual:        return "Equal (Numpad)";
        case Keyboard::Scan::NumpadEnter:        return "Enter (Numpad)";
        case Keyboard::Scan::NumpadDecimal:      return "Decimal (Numpad)";

        case Keyboard::Scan::Numpad0:            return "0 (Numpad)";
        case Keyboard::Scan::Numpad1:            return "1 (Numpad)";
        case Keyboard::Scan::Numpad2:            return "2 (Numpad)";
        case Keyboard::Scan::Numpad3:            return "3 (Numpad)";
        case Keyboard::Scan::Numpad4:            return "4 (Numpad)";
        case Keyboard::Scan::Numpad5:            return "5 (Numpad)";
        case Keyboard::Scan::Numpad6:            return "6 (Numpad)";
        case Keyboard::Scan::Numpad7:            return "7 (Numpad)";
        case Keyboard::Scan::Numpad8:            return "8 (Numpad)";
        case Keyboard::Scan::Numpad9:            return "9 (Numpad)";

        case Keyboard::Scan::Application:        return "Application";
        case Keyboard::Scan::Execute:            return "Execute";
        case Keyboard::Scan::Help:               return "Help";
        case Keyboard::Scan::Menu:               return "Menu";
        case Keyboard::Scan::Select:             return "Select";
        case Keyboard::Scan::Stop:               return "Stop";
        case Keyboard::Scan::Redo:               return "Redo";
        case Keyboard::Scan::Undo:               return "Undo";
        case Keyboard::Scan::Cut:                return "Cut";
        case Keyboard::Scan::Copy:               return "Copy";
        case Keyboard::Scan::Paste:              return "Paste";
        case Keyboard::Scan::Search:             return "Search";

        case Keyboard::Scan::VolumeMute:         return "Volume Mute";
        case Keyboard::Scan::VolumeUp:           return "Volume Up";
        case Keyboard::Scan::VolumeDown:         return "Volume Down";

        case Keyboard::Scan::LControl:           return "Left Control";
        case Keyboard::Scan::LShift:             return "Left Shift";
        case Keyboard::Scan::LAlt:               return "Left Alt";
        case Keyboard::Scan::LSystem:            return "Left System";
        case Keyboard::Scan::RControl:           return "Right Control";
        case Keyboard::Scan::RShift:             return "Right Shift";
        case Keyboard::Scan::RAlt:               return "Right Alt";
        case Keyboard::Scan::RSystem:            return "Right System";

        case Keyboard::Scan::LaunchApplication1: return "Launch Application 1";
        case Keyboard::Scan::LaunchApplication2: return "Launch Application 2";
        case Keyboard::Scan::Favorites:          return "Favorites";
        case Keyboard::Scan::Back:               return "Back";
        case Keyboard::Scan::Forward:            return "Forward";
        case Keyboard::Scan::MediaNextTrack:     return "Media Next Track";
        case Keyboard::Scan::MediaPlayPause:     return "Media Play Pause";
        case Keyboard::Scan::MediaPreviousTrack: return "Media Previous Track";
        case Keyboard::Scan::MediaStop:          return "Media Stop";
        case Keyboard::Scan::HomePage:           return "Home Page";
        case Keyboard::Scan::Refresh:            return "Refresh";
        case Keyboard::Scan::LaunchMail:         return "Launch Mail";
        case Keyboard::Scan::LaunchMediaSelect:  return "Launch Media Select";

        default:                                 return "Unknown Scancode";
    }
}